

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.h
# Opt level: O3

void __thiscall basisu::etc_block::get_block_colors_etc1s(etc_block *this,color_rgba *pBlock_colors)

{
  uint64_t uVar1;
  int iVar2;
  uint8_t uVar3;
  undefined8 in_RAX;
  ulong uVar4;
  uint8_t uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  color_rgba b;
  undefined8 uStack_28;
  
  uVar1 = (this->field_0).m_uint64;
  auVar12._0_2_ = (ushort)uVar1 >> 3;
  auVar12._2_2_ = (ushort)(uVar1 >> 0x10) >> 3;
  auVar12._4_2_ = (ushort)(uVar1 >> 0x20) >> 3;
  auVar12._6_2_ = (ushort)(uVar1 >> 0x33);
  auVar12._8_8_ = 0;
  auVar12 = pmovzxbw(auVar12 & _DAT_0031ebf0,auVar12 & _DAT_0031ebf0);
  auVar13 = psllw(auVar12,10);
  auVar12 = psllw(auVar12,5);
  uStack_28 = in_RAX;
  unpack_color5((color_rgba *)((long)&uStack_28 + 4),
                auVar13._0_2_ | auVar12._2_2_ | (ushort)((this->field_0).m_bytes[2] >> 3),true);
  uVar4 = (ulong)((this->field_0).m_bytes[3] >> 1 & 0xfffffff0);
  uVar6 = (uint)uStack_28._4_1_;
  iVar2 = *(int *)(g_etc1_inten_tables + uVar4);
  uVar9 = iVar2 + uVar6;
  uVar5 = 0xff;
  if (uVar9 < 0xff) {
    uVar5 = (uint8_t)uVar9;
  }
  uVar3 = '\0';
  if ((int)uVar9 < 0) {
    uVar5 = '\0';
  }
  uVar7 = (uint)uStack_28._5_1_;
  uVar9 = iVar2 + uVar7;
  uVar10 = 0xff;
  if (uVar9 < 0xff) {
    uVar10 = (uint8_t)uVar9;
  }
  if ((int)uVar9 < 0) {
    uVar10 = '\0';
  }
  uVar8 = iVar2 + (uint)uStack_28._6_1_;
  uVar9 = 0xff;
  if (uVar8 < 0xff) {
    uVar9 = uVar8;
  }
  iVar2 = *(int *)(g_etc1_inten_tables + uVar4 + 4);
  uVar11 = (uint8_t)uVar9;
  if ((int)uVar8 < 0) {
    uVar11 = uVar3;
  }
  (pBlock_colors->field_0).m_comps[0] = uVar5;
  (pBlock_colors->field_0).m_comps[1] = uVar10;
  (pBlock_colors->field_0).m_comps[2] = uVar11;
  uVar9 = iVar2 + uVar6;
  uVar5 = 0xff;
  if (uVar9 < 0xff) {
    uVar5 = (uint8_t)uVar9;
  }
  if ((int)uVar9 < 0) {
    uVar5 = '\0';
  }
  uVar9 = iVar2 + uVar7;
  uVar10 = 0xff;
  if (uVar9 < 0xff) {
    uVar10 = (uint8_t)uVar9;
  }
  if ((int)uVar9 < 0) {
    uVar10 = '\0';
  }
  uVar8 = iVar2 + (uint)uStack_28._6_1_;
  uVar9 = 0xff;
  if (uVar8 < 0xff) {
    uVar9 = uVar8;
  }
  uVar11 = (uint8_t)uVar9;
  if ((int)uVar8 < 0) {
    uVar11 = '\0';
  }
  (pBlock_colors->field_0).m_comps[3] = 0xff;
  pBlock_colors[1].field_0.m_comps[0] = uVar5;
  pBlock_colors[1].field_0.m_comps[1] = uVar10;
  pBlock_colors[1].field_0.m_comps[2] = uVar11;
  pBlock_colors[1].field_0.m_comps[3] = 0xff;
  iVar2 = *(int *)(g_etc1_inten_tables + uVar4 + 8);
  uVar9 = iVar2 + uVar6;
  uVar5 = 0xff;
  if (uVar9 < 0xff) {
    uVar5 = (uint8_t)uVar9;
  }
  if ((int)uVar9 < 0) {
    uVar5 = '\0';
  }
  uVar9 = iVar2 + uVar7;
  uVar10 = 0xff;
  if (uVar9 < 0xff) {
    uVar10 = (uint8_t)uVar9;
  }
  if ((int)uVar9 < 0) {
    uVar10 = '\0';
  }
  uVar8 = iVar2 + (uint)uStack_28._6_1_;
  uVar9 = 0xff;
  if (uVar8 < 0xff) {
    uVar9 = uVar8;
  }
  uVar11 = (uint8_t)uVar9;
  if ((int)uVar8 < 0) {
    uVar11 = uVar3;
  }
  pBlock_colors[2].field_0.m_comps[0] = uVar5;
  pBlock_colors[2].field_0.m_comps[1] = uVar10;
  pBlock_colors[2].field_0.m_comps[2] = uVar11;
  pBlock_colors[2].field_0.m_comps[3] = 0xff;
  iVar2 = *(int *)(g_etc1_inten_tables + uVar4 + 0xc);
  uVar6 = uVar6 + iVar2;
  uVar9 = 0xff;
  if (uVar6 < 0xff) {
    uVar9 = uVar6;
  }
  uVar5 = (uint8_t)uVar9;
  if ((int)uVar6 < 0) {
    uVar5 = '\0';
  }
  uVar7 = uVar7 + iVar2;
  uVar9 = 0xff;
  if (uVar7 < 0xff) {
    uVar9 = uVar7;
  }
  uVar10 = (uint8_t)uVar9;
  if ((int)uVar7 < 0) {
    uVar10 = uVar3;
  }
  uVar6 = iVar2 + (uint)uStack_28._6_1_;
  uVar9 = 0xff;
  if (uVar6 < 0xff) {
    uVar9 = uVar6;
  }
  uVar3 = (uint8_t)uVar9;
  if ((int)uVar6 < 0) {
    uVar3 = '\0';
  }
  pBlock_colors[3].field_0.m_comps[0] = uVar5;
  pBlock_colors[3].field_0.m_comps[1] = uVar10;
  pBlock_colors[3].field_0.m_comps[2] = uVar3;
  pBlock_colors[3].field_0.m_comps[3] = 0xff;
  return;
}

Assistant:

void get_block_colors_etc1s(color_rgba* pBlock_colors) const
		{
			color_rgba b;

			unpack_color5(b, get_base5_color(), true);

			const int* pInten_table = g_etc1_inten_tables[get_inten_table(0)];

			pBlock_colors[0].set(clamp255(b.r + pInten_table[0]), clamp255(b.g + pInten_table[0]), clamp255(b.b + pInten_table[0]), 255);
			pBlock_colors[1].set(clamp255(b.r + pInten_table[1]), clamp255(b.g + pInten_table[1]), clamp255(b.b + pInten_table[1]), 255);
			pBlock_colors[2].set(clamp255(b.r + pInten_table[2]), clamp255(b.g + pInten_table[2]), clamp255(b.b + pInten_table[2]), 255);
			pBlock_colors[3].set(clamp255(b.r + pInten_table[3]), clamp255(b.g + pInten_table[3]), clamp255(b.b + pInten_table[3]), 255);
		}